

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O1

int CVmObjString::getp_findAll(vm_val_t *retval,vm_val_t *self_val,char *str,uint *argc)

{
  vm_val_t *this;
  vm_val_t *pvVar1;
  undefined1 uVar2;
  anon_union_8_8_cb74652f_for_val aVar3;
  vm_datatype_t *pvVar4;
  undefined4 uVar5;
  CVmObjPageEntry *this_00;
  size_t idx;
  int iVar6;
  vm_obj_id_t vVar7;
  char *substr;
  byte *str_00;
  int *piVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  byte *pbVar12;
  long lVar13;
  CVmObjPattern *pat;
  uint uVar14;
  uint uVar15;
  int iVar16;
  byte *basestr;
  long lVar17;
  ulong len;
  uint local_100;
  int match_len;
  CVmObjPattern *local_f8;
  byte *local_f0;
  ulong local_e8;
  ulong local_e0;
  vm_val_t *local_d8;
  CVmObjPageEntry *local_d0;
  vm_val_t *local_c8;
  size_t local_c0;
  uint local_b4;
  uint local_b0;
  uint local_ac;
  vm_val_t ele;
  int match_cofs;
  vm_rcdesc rc;
  
  if (argc == (uint *)0x0) {
    uVar14 = 0;
  }
  else {
    uVar14 = *argc;
  }
  if (getp_findAll(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') {
    getp_findAll();
  }
  iVar6 = CVmObject::get_prop_check_argc(retval,argc,&getp_findAll::desc);
  pvVar1 = sp_;
  if (iVar6 == 0) {
    local_e0 = (ulong)*(ushort *)str;
    this = sp_ + -1;
    substr = vm_val_t::get_as_string(this);
    local_e8 = 0;
    if (substr == (char *)0x0) {
      if ((this->typ == VM_OBJ) &&
         (uVar9 = pvVar1[-1].val.obj,
         iVar6 = (**(code **)(*(long *)&G_obj_table_X.pages_[uVar9 >> 0xc][uVar9 & 0xfff].ptr_ + 8))
                           (), iVar6 != 0)) {
        uVar9 = pvVar1[-1].val.obj;
        local_f8 = (CVmObjPattern *)
                   ((G_obj_table_X.pages_[uVar9 >> 0xc]->ptr_).obj_ + (uVar9 & 0xfff) * 0x18);
      }
      else {
        local_f8 = (CVmObjPattern *)0x0;
      }
      if (local_f8 == (CVmObjPattern *)0x0) goto LAB_00289f65;
    }
    else {
      local_f8 = (CVmObjPattern *)0x0;
    }
    len = local_e0;
    if (uVar14 < 2) {
      local_100 = 0xfffffffe;
      local_c8 = (vm_val_t *)0x0;
    }
    else {
      pvVar1 = sp_ + -2;
      local_c8 = pvVar1;
      if (sp_[-2].typ == VM_NIL) {
        local_100 = 0xfffffffe;
      }
      else {
        iVar6 = vm_val_t::is_func_ptr(pvVar1);
        if (iVar6 == 0) {
LAB_00289f65:
          err_throw(0x900);
        }
        CVmFuncPtr::set((CVmFuncPtr *)&rc,pvVar1);
        uVar2 = (undefined1)(rc.argp)->typ;
        uVar9 = (byte)uVar2 & 0x7f;
        if ((char)uVar2 < '\0') {
          local_e8 = 0xffffffff;
        }
        else {
          local_e8 = (ulong)(*(byte *)((long)&(rc.argp)->typ + 1) + uVar9);
        }
        local_100 = uVar9 - 2;
      }
    }
    vVar7 = CVmObjList::create(0,10);
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar7;
    local_d0 = G_obj_table_X.pages_[vVar7 >> 0xc] + (vVar7 & 0xfff);
    uVar11 = (ulong)**(ushort **)((long)&local_d0->ptr_ + 8);
    if (uVar11 != 0) {
      CVmObjList::cons_clear((CVmObjList *)local_d0,0,uVar11 - 1);
    }
    pvVar1 = sp_;
    uVar5 = *(undefined4 *)&retval->field_0x4;
    aVar3 = retval->val;
    sp_ = sp_ + 1;
    pvVar1->typ = retval->typ;
    *(undefined4 *)&pvVar1->field_0x4 = uVar5;
    pvVar1->val = aVar3;
    local_c0 = 0;
    local_b4 = uVar14;
    if (len != 0) {
      basestr = (byte *)(str + 2);
      iVar6 = (int)local_e8;
      local_b0 = iVar6 - 2;
      pat = local_f8;
      local_f0 = basestr;
      local_d8 = self_val;
      do {
        str_00 = (byte *)find_substr(self_val,(char *)basestr,(char *)local_f0,len,substr,pat,
                                     &match_cofs,&match_len);
        if (str_00 != (byte *)0x0) {
          if (local_c8 == (vm_val_t *)0x0) {
            vVar7 = create(0,(char *)str_00,(long)match_len);
            ele.typ = VM_OBJ;
            ele.val.obj = vVar7;
          }
          else {
            uVar14 = G_bif_tads_globals_X->rex_searcher->group_cnt_;
            uVar15 = local_b0;
            if ((int)local_e8 == -1) {
              uVar15 = uVar14;
            }
            uVar10 = local_100;
            if ((int)local_100 < (int)uVar15) {
              uVar10 = uVar15;
            }
            local_e0 = len;
            if ((int)uVar10 < 1) {
              uVar15 = 0;
            }
            else {
              if ((int)uVar15 <= (int)local_100) {
                uVar15 = local_100;
              }
              lVar13 = (long)(int)uVar15;
              lVar17 = lVar13 * 8 + 0x1c;
              local_ac = uVar10;
              do {
                pvVar1 = sp_;
                if ((int)uVar14 < lVar13) {
                  piVar8 = (int *)0x0;
                }
                else {
                  piVar8 = (int *)((long)&(G_bif_tads_globals_X->rex_searcher->super_CRegexSearcher)
                                          .stack_.buf_ + lVar17);
                }
                if (((piVar8 == (int *)0x0) || (*piVar8 < 0)) || (piVar8[1] < 0)) {
                  pvVar4 = &sp_->typ;
                  sp_ = sp_ + 1;
                  *pvVar4 = VM_NIL;
                }
                else {
                  sp_ = sp_ + 1;
                  vVar7 = create(0,(char *)(basestr + *piVar8),(long)piVar8[1] - (long)*piVar8);
                  pvVar1->typ = VM_OBJ;
                  (pvVar1->val).obj = vVar7;
                }
                lVar13 = lVar13 + -1;
                lVar17 = lVar17 + -8;
                uVar15 = local_ac;
              } while ((int)lVar13 != 0);
            }
            len = local_e0;
            pvVar1 = sp_;
            if (1 < iVar6 || iVar6 == -1) {
              if (str_00 == basestr || (long)str_00 - (long)basestr < 0) {
                vVar7 = 1;
              }
              else {
                vVar7 = 1;
                pbVar12 = basestr;
                do {
                  pbVar12 = pbVar12 + (ulong)(((*pbVar12 >> 5 & 1) != 0) + 1 &
                                             (uint)(*pbVar12 >> 7) * 3) + 1;
                  vVar7 = vVar7 + 1;
                } while (pbVar12 < str_00);
              }
              pvVar4 = &sp_->typ;
              sp_ = sp_ + 1;
              *pvVar4 = VM_INT;
              (pvVar1->val).obj = vVar7;
              uVar15 = uVar15 + 1;
            }
            pvVar1 = sp_;
            if (0 < iVar6 || iVar6 == -1) {
              sp_ = sp_ + 1;
              vVar7 = create(0,(char *)str_00,(long)match_len);
              pvVar1->typ = VM_OBJ;
              (pvVar1->val).obj = vVar7;
              uVar15 = uVar15 + 1;
            }
            CVmRun::call_func_ptr(&G_interpreter_X,local_c8,uVar15,&rc,0);
            ele.typ = r0_.typ;
            ele._4_4_ = r0_._4_4_;
            ele.val = r0_.val;
          }
          idx = local_c0;
          this_00 = local_d0;
          pbVar12 = local_f0;
          iVar16 = (int)local_f0;
          CVmObjList::cons_ensure_space((CVmObjList *)local_d0,local_c0,0);
          CVmObjList::cons_set_element((CVmObjList *)this_00,idx,&ele);
          lVar17 = (long)(((int)str_00 - iVar16) + match_len);
          local_f0 = pbVar12 + lVar17;
          len = len - lVar17;
          pat = local_f8;
          self_val = local_d8;
          if ((match_len == 0) && (len != 0)) {
            local_f0 = local_f0 +
                       (ulong)(((*local_f0 >> 5 & 1) != 0) + 1 & (uint)(*local_f0 >> 7) * 3) + 1;
          }
        }
      } while ((str_00 != (byte *)0x0) && (local_c0 = local_c0 + 1, len != 0));
    }
    *(short *)*(char **)((long)&local_d0->ptr_ + 8) = (short)local_c0;
    sp_ = sp_ + -(long)(int)(local_b4 + 1);
  }
  return 1;
}

Assistant:

int CVmObjString::getp_findAll(VMG_ vm_val_t *retval,
                               const vm_val_t *self_val, const char *str,
                               uint *argc)
{
    /* check arguments */
    uint orig_argc = (argc != 0 ? *argc : 0);
    static CVmNativeCodeDesc desc(1, 1);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the string length and buffer pointer */
    size_t len = vmb_get_len(str);
    str += VMB_LEN;

    /* remember the base string */
    const char *basestr = str;

    /* retrieve the string or regex pattern to find */
    vm_val_t *targ = G_stk->get(0);
    const char *targstr = 0;
    CVmObjPattern *targpat = 0;
    if ((targstr = targ->get_as_string(vmg0_)) != 0)
    {
        /* we have a simple string to find */
    }
    else if ((targpat = vm_val_cast(CVmObjPattern, targ)) != 0)
    {
        /* it's a pattern */
    }
    else
    {
        /* we need a string or a pattern; other values are invalid */
        err_throw(VMERR_BAD_TYPE_BIF);
    }

    /* retrieve the filter callback function, if present */
    vm_val_t *func = 0;
    int func_argc_min = 0, func_argc_max = 0;
    vm_rcdesc rc;
    if (orig_argc >= 2 && (func = G_stk->get(1))->typ != VM_NIL)
    {
        /* make sure it's a function */
        if (!func->is_func_ptr(vmg0_))
            err_throw(VMERR_BAD_TYPE_BIF);

        /* note how many arguments the function accepts */
        CVmFuncPtr fd(vmg_ func);
        func_argc_min = fd.get_min_argc();
        func_argc_max = fd.is_varargs() ? -1 : fd.get_max_argc();
    }

    /* 
     *   create a tentative list for the results (we'll resize this as needed
     *   as we add elements) 
     */
    retval->set_obj(CVmObjList::create(vmg_ FALSE, 10));
    CVmObjList *lst = (CVmObjList *)vm_objp(vmg_ retval->val.obj);

    /* clear it initially and push it for gc protection */
    lst->cons_clear();
    G_stk->push(retval);

    /* repeatedly search for the pattern */
    int cnt;
    for (cnt = 0 ; len != 0 ; ++cnt)
    {
        /* search for the next element */
        int match_cofs, match_len, match_bofs;
        const char *nxt = find_substr(
            vmg_ self_val, basestr, str, len, targstr, targpat,
            &match_cofs, &match_len);

        /* if we didn't find a match, we're done */
        if (nxt == 0)
            break;

        /* figure the byte offset of the match */
        match_bofs = nxt - str;

        /* call the callback, or just return the match text directly */
        vm_val_t ele;
        if (func == 0)
        {
            /* no callback - just use the match text, as a new string */
            ele.set_obj(CVmObjString::create(vmg_ FALSE, nxt, match_len));
        }
        else
        {
            /* we have a callback - push arguments */
            int fargc = 0;

            /*
             *   Figure out how many groups are populated, and how many the
             *   function expects.  If the function takes varargs, it expects
             *   all of the groups.  If it takes fixed arguments, it expects
             *   at most max_argc-2.  In addition, the function expects a
             *   minimum of min_argc-2 groups, and expects us to add nil
             *   arguments for any unpopulated groups to fill out that
             *   minimum.
             */
            int gc_actual = G_bif_tads_globals->rex_searcher->get_group_cnt();
            int gc_wanted = (func_argc_max == -1
                             ? gc_actual : func_argc_max - 2);
            if (gc_wanted < func_argc_min - 2)
                gc_wanted = func_argc_min - 2;

            /* push the groups, last to first */
            for (int i = gc_wanted ; i > 0 ; )
            {
                /* get the group, if it exists */
                const re_group_register *reg = 0;
                if (--i < gc_actual)
                {
                    /* valid group - get the group information */
                    reg = G_bif_tads_globals->rex_searcher->get_group_reg(i);
                }

                /* if the group is populated, push its text, otherwise nil */
                if (reg != 0 && reg->start_ofs >= 0 && reg->end_ofs >= 0)
                {
                    /* push the group text as a new string */
                    G_stk->push()->set_obj(CVmObjString::create(
                        vmg_ FALSE, basestr + reg->start_ofs,
                        reg->end_ofs - reg->start_ofs));
                }
                else
                {
                    /* unpopulated group - push nil */
                    G_stk->push()->set_nil();
                }

                /* count it */
                ++fargc;
            }

            /* if the index value is desired, push it */
            if (func_argc_max == -1 || func_argc_max >= 2)
            {
                /* push the index of the match relative to basestr */
                G_stk->push()->set_int(
                    utf8_ptr::s_len(basestr, nxt - basestr) + 1);
                ++fargc;
            }

            /* if the match string value is desired, push it */
            if (func_argc_max == -1 || func_argc_max >= 1)
            {
                /* push the match text */
                G_stk->push()->set_obj(
                    CVmObjString::create(vmg_ FALSE, nxt, match_len));
                ++fargc;
            }

            /* call the callback */
            G_interpreter->call_func_ptr(vmg_ func, fargc, &rc, 0);

            /* retrieve the return value */
            ele = *G_interpreter->get_r0();
        }

        /* add it to the list */
        lst->cons_ensure_space(vmg_ cnt, 0);
        lst->cons_set_element(cnt, &ele);

        /* skip the matched text */
        size_t skip = match_bofs + match_len;
        str += skip;
        len -= skip;

        /* 
         *   if we matched zero characters, skip one character to prevent an
         *   infinite loop 
         */
        if (match_len == 0 && len != 0)
            str += utf8_ptr::s_bytelen(str, 1);
    }

    /* finalize the list length */
    lst->cons_set_len(cnt);

    /* discard arguments and gc protection */
    G_stk->discard(orig_argc + 1);

    /* handled */
    return TRUE;
}